

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

void server_poll_cb(uv_poll_t *handle,int status,int events)

{
  server_context_t *context;
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_os_sock_t sock;
  socklen_t addr_len;
  sockaddr_in addr;
  connection_context_t *connection_context;
  server_context_t *server_context;
  int events_local;
  int status_local;
  uv_poll_t *handle_local;
  
  context = (server_context_t *)handle->data;
  r = 0x10;
  iVar1 = accept(context->sock,(sockaddr *)&sock,(socklen_t *)&r);
  if ((long)iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x1fa,"sock",">=","0",(long)iVar1,">=",0);
    abort();
  }
  addr.sin_zero = (uchar  [8])create_connection_context(iVar1,1);
  *(uint *)((long)addr.sin_zero + 0x124) = 7;
  iVar1 = uv_poll_start(addr.sin_zero,7,connection_poll_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x202,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = context->connections + 1;
  context->connections = iVar1;
  if (iVar1 == 5) {
    close_socket(context->sock);
    destroy_server_context(context);
  }
  return;
}

Assistant:

static void server_poll_cb(uv_poll_t* handle, int status, int events) {
  server_context_t* server_context = (server_context_t*)
                                          handle->data;
  connection_context_t* connection_context;
  struct sockaddr_in addr;
  socklen_t addr_len;
  uv_os_sock_t sock;
  int r;

  addr_len = sizeof addr;
  sock = accept(server_context->sock, (struct sockaddr*) &addr, &addr_len);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

  connection_context = create_connection_context(sock, 1);
  connection_context->events = UV_READABLE | UV_WRITABLE | UV_DISCONNECT;
  r = uv_poll_start(&connection_context->poll_handle,
                    UV_READABLE | UV_WRITABLE | UV_DISCONNECT,
                    connection_poll_cb);
  ASSERT_OK(r);

  if (++server_context->connections == NUM_CLIENTS) {
    close_socket(server_context->sock);
    destroy_server_context(server_context);
  }
}